

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall
duckdb::AddColumnInfo::AddColumnInfo(AddColumnInfo *this,ColumnDefinition *new_column_p)

{
  AlterTableInfo::AlterTableInfo(&this->super_AlterTableInfo,ADD_COLUMN);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AddColumnInfo_0178e9f8;
  ColumnDefinition::ColumnDefinition(&this->new_column,new_column_p);
  return;
}

Assistant:

AddColumnInfo::AddColumnInfo(ColumnDefinition new_column_p)
    : AlterTableInfo(AlterTableType::ADD_COLUMN), new_column(std::move(new_column_p)) {
}